

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZTriangleTorus>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZTriangleTorus> *cp)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZTriangleTorus>).super_TPZGeoEl =
       &PTR__TPZSavable_016d4c20;
  TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZTriangleTorus>,&PTR_PTR_016d4510,DestMesh,
             &cp->super_TPZGeoElRefLess<pzgeom::TPZTriangleTorus>);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZTriangleTorus>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_016d4210;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fSubEl).fNAlloc = 0;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  pTVar2 = (cp->fRefPattern).fRef;
  (this->fRefPattern).fRef = pTVar2;
  LOCK();
  paVar1 = &pTVar2->fCounter;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  TPZVec<long>::operator=(&this->fSubEl,&cp->fSubEl);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh, const TPZGeoElRefPattern<TGeo> &cp):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp),
fRefPattern(cp.fRefPattern) {

	this->fSubEl = cp.fSubEl;
}